

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          vector<bool,_std::allocator<bool>_> *code,uint node,uint pos,ulint i)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar1;
  size_type __n;
  ulong uVar2;
  reference rVar3;
  
  __n = (size_type)pos;
  while( true ) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::at(code,__n);
    uVar2 = rVar3._M_mask & *rVar3._M_p;
    i = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                  ((this->wavelet_tree).
                   super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + node,i,uVar2 != 0);
    __n = (size_type)((int)__n + 1);
    if ((ulong)(code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset +
        ((long)(code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p -
        (long)(code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p) * 8 == __n) break;
    pvVar1 = &this->child0;
    if (uVar2 != 0) {
      pvVar1 = &this->child1;
    }
    node = (uint)(pvVar1->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_start[node];
  }
  return i;
}

Assistant:

inline ulint rank(vector<bool> * code, uint node, uint pos, ulint i){

		bool bit = code->at(pos);
		//ulint bit_rank = wavelet_tree[node].rank(bit,i);
		ulint bit_rank = wavelet_tree[node].rank(i,bit);

		if(pos+1==code->size())
			return bit_rank;

		uint next_node = (bit==0?child0[node]:child1[node]);//find next node

		return rank(code, next_node, pos+1, bit_rank);

	}